

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

StringRef * Potassco::operator<<(StringRef *str,uchar *val)

{
  ulong uVar1;
  string *in_RSI;
  StringRef *in_RDI;
  int in_stack_ffffffffffffffec;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::append((ulong)in_RDI->out,'\x01');
  }
  xconvert(in_RSI,in_stack_ffffffffffffffec);
  return in_RDI;
}

Assistant:

inline StringRef& operator<<(StringRef& str, const T& val) {
	if (!str.out->empty()) { str.out->append(1, ','); }
	xconvert(*str.out, val);
	return str;
}